

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TestCase *this;
  TestInfo *test_info;
  int j;
  int i;
  
  iVar2 = UnitTest::failed_test_count(unit_test);
  if (iVar2 != 0) {
    for (iVar2 = 0;
        iVar2 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                    super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(unit_test->impl_->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar2 = iVar2 + 1) {
      this = UnitTest::GetTestCase(unit_test,iVar2);
      if (this->should_run_ == true) {
        iVar3 = TestCase::failed_test_count(this);
        if (iVar3 != 0) {
          for (iVar3 = 0;
              iVar3 < (int)((ulong)((long)(this->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->test_info_list_).
                                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
              iVar3 = iVar3 + 1) {
            test_info = TestCase::GetTestInfo(this,iVar3);
            if (test_info->should_run_ == true) {
              bVar1 = TestResult::Passed(&test_info->result_);
              if (!bVar1) {
                ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
                printf("%s.%s",(this->name_).c_str_,(test_info->name_)._M_dataplus._M_p);
                PrintFullTestCommentIfPresent(test_info);
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  if (failed_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    const TestCase& test_case = *unit_test.GetTestCase(i);
    if (!test_case.should_run() || (test_case.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_case.total_test_count(); ++j) {
      const TestInfo& test_info = *test_case.GetTestInfo(j);
      if (!test_info.should_run() || test_info.result()->Passed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_case.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
}